

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

TimeZone * __thiscall
icu_63::TimeZoneFormat::createTimeZoneForOffset(TimeZoneFormat *this,int32_t offset)

{
  ConstChar16Ptr local_68;
  UnicodeString local_60;
  int32_t local_1c;
  TimeZoneFormat *pTStack_18;
  int32_t offset_local;
  TimeZoneFormat *this_local;
  
  local_1c = offset;
  pTStack_18 = this;
  if (offset == 0) {
    ConstChar16Ptr::ConstChar16Ptr(&local_68,(char16_t *)TZID_GMT);
    UnicodeString::UnicodeString(&local_60,'\x01',&local_68,-1);
    this_local = (TimeZoneFormat *)TimeZone::createTimeZone(&local_60);
    UnicodeString::~UnicodeString(&local_60);
    ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  }
  else {
    this_local = (TimeZoneFormat *)ZoneMeta::createCustomTimeZone(offset);
  }
  return (TimeZone *)this_local;
}

Assistant:

TimeZone*
TimeZoneFormat::createTimeZoneForOffset(int32_t offset) const {
    if (offset == 0) {
        // when offset is 0, we should use "Etc/GMT"
        return TimeZone::createTimeZone(UnicodeString(TRUE, TZID_GMT, -1));
    }
    return ZoneMeta::createCustomTimeZone(offset);
}